

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O0

string * __thiscall
RenX_Ladder_WebPlugin::generate_profile_page_abi_cxx11_
          (RenX_Ladder_WebPlugin *this,LadderDatabase *db,uint8_t format,uint64_t steam_id,
          query_table_type *query_params)

{
  RenX_Ladder_WebPlugin *pRVar1;
  long lVar2;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  string local_1a8;
  __sv_type local_188;
  __sv_type local_178;
  undefined1 local_168 [16];
  __sv_type local_158;
  string local_148;
  __sv_type local_128;
  __sv_type local_118;
  undefined1 local_108 [16];
  __sv_type local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  undefined1 local_d8 [8];
  string profile_data;
  Entry *local_a8;
  Entry *entry;
  string local_90;
  string local_60;
  RenX_Ladder_WebPlugin *local_40;
  string *result;
  query_table_type *query_params_local;
  uint64_t steam_id_local;
  LadderDatabase *pLStack_20;
  uint8_t format_local;
  LadderDatabase *db_local;
  RenX_Ladder_WebPlugin *this_local;
  
  result = (string *)query_params;
  query_params_local = (query_table_type *)steam_id;
  steam_id_local._7_1_ = format;
  pLStack_20 = db;
  db_local = (LadderDatabase *)this;
  pRVar1 = (RenX_Ladder_WebPlugin *)operator_new(0x20);
  std::__cxx11::string::string((string *)pRVar1);
  local_40 = pRVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar1,0x800);
  if ((steam_id_local._7_1_ & this->FLAG_INCLUDE_PAGE_HEADER) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               &this->header);
  }
  pRVar1 = local_40;
  if ((steam_id_local._7_1_ & this->FLAG_INCLUDE_SEARCH) != 0) {
    generate_search_abi_cxx11_(&local_60,pLStack_20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar1,&local_60
              );
    std::__cxx11::string::~string((string *)&local_60);
  }
  pRVar1 = local_40;
  if ((steam_id_local._7_1_ & this->FLAG_INCLUDE_SELECTOR) != 0) {
    generate_database_selector_abi_cxx11_(&local_90,pLStack_20,(query_table_type *)result);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar1,&local_90
              );
    std::__cxx11::string::~string((string *)&local_90);
  }
  lVar2 = RenX::LadderDatabase::getEntries();
  pRVar1 = local_40;
  if (lVar2 == 0) {
    _entry = sv("Error: No ladder data",0x15);
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)pRVar1,(basic_string_view<char,_std::char_traits<char>_> *)&entry);
    if ((steam_id_local._7_1_ & this->FLAG_INCLUDE_PAGE_FOOTER) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &this->footer);
    }
    this_local = local_40;
  }
  else {
    local_a8 = (Entry *)RenX::LadderDatabase::getHead();
    pRVar1 = local_40;
    for (; (local_a8 != (Entry *)0x0 &&
           ((query_table_type *)local_a8->steam_id != query_params_local));
        local_a8 = local_a8->next) {
    }
    if (local_a8 == (Entry *)0x0) {
      join_0x00000010_0x00000000_ = sv("Error: Player not found",0x17);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)pRVar1,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 ((long)&profile_data.field_2 + 8));
    }
    else {
      std::__cxx11::string::string((string *)local_d8,&this->entry_profile);
      RenX::processTags((string *)local_d8,local_a8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      pRVar1 = local_40;
      local_e8 = sv("<div class=\"profile-navigation\">",0x20);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)pRVar1,&local_e8);
      if (local_a8->prev != (Entry *)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   &this->entry_profile_previous);
        local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)(RenX::tags + 0x14e8));
        local_108 = RenX::LadderDatabase::getName();
        RenX::replace_tag(local_d8,local_f8._M_len,local_f8._M_str,local_108._0_8_,local_108._8_8_);
        local_118 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)(RenX::tags + 0x14c8));
        string_printf_abi_cxx11_(&local_148,"%llu",local_a8->prev->steam_id);
        local_128 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_148);
        RenX::replace_tag(local_d8,local_118._M_len,local_118._M_str,local_128._M_len,
                          local_128._M_str);
        std::__cxx11::string::~string((string *)&local_148);
        RenX::processTags((string *)local_d8,local_a8->prev);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      }
      if (local_a8->next != (Entry *)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   &this->entry_profile_next);
        local_158 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)(RenX::tags + 0x14e8));
        local_168 = RenX::LadderDatabase::getName();
        RenX::replace_tag(local_d8,local_158._M_len,local_158._M_str,local_168._0_8_,local_168._8_8_
                         );
        local_178 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)(RenX::tags + 0x908));
        string_printf_abi_cxx11_(&local_1a8,"%llu",local_a8->next->steam_id);
        local_188 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1a8);
        RenX::replace_tag(local_d8,local_178._M_len,local_178._M_str,local_188._M_len,
                          local_188._M_str);
        std::__cxx11::string::~string((string *)&local_1a8);
        RenX::processTags((string *)local_d8,local_a8->next);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      }
      pRVar1 = local_40;
      local_1b8 = sv("</div>",6);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)pRVar1,&local_1b8);
      std::__cxx11::string::~string((string *)local_d8);
    }
    if ((steam_id_local._7_1_ & this->FLAG_INCLUDE_PAGE_FOOTER) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &this->footer);
    }
    this_local = local_40;
  }
  return (string *)this_local;
}

Assistant:

std::string* RenX_Ladder_WebPlugin::generate_profile_page(RenX::LadderDatabase *db, uint8_t format, uint64_t steam_id, const query_table_type& query_params) {
	std::string* result = new std::string();
	result->reserve(2048);

	if ((format & this->FLAG_INCLUDE_PAGE_HEADER) != 0)
		result->append(RenX_Ladder_WebPlugin::header);

	if ((format & this->FLAG_INCLUDE_SEARCH) != 0) // Search
		result->append(generate_search(db));

	if ((format & this->FLAG_INCLUDE_SELECTOR) != 0) // Selector
		result->append(generate_database_selector(db, query_params));

	if (db->getEntries() == 0) { // No ladder data
		result->append("Error: No ladder data"sv);

		if ((format & this->FLAG_INCLUDE_PAGE_FOOTER) != 0) // Footer
			result->append(RenX_Ladder_WebPlugin::footer);

		return result;
	}

	RenX::LadderDatabase::Entry *entry = db->getHead();
	while (entry != nullptr) {
		if (entry->steam_id == steam_id) // match found
			break;
		entry = entry->next;
	}

	if (entry == nullptr) {
		result->append("Error: Player not found"sv);
	}
	else {
		std::string profile_data(RenX_Ladder_WebPlugin::entry_profile);
		RenX::processTags(profile_data, *entry);
		result->append(profile_data);

		result->append("<div class=\"profile-navigation\">"sv);
		if (entry->prev != nullptr)
		{
			profile_data = RenX_Ladder_WebPlugin::entry_profile_previous;
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_OBJECT_TAG, db->getName());
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_WEAPON_TAG, string_printf("%llu", entry->prev->steam_id));
			RenX::processTags(profile_data, *entry->prev);
			result->append(profile_data);
		}
		if (entry->next != nullptr)
		{
			profile_data = RenX_Ladder_WebPlugin::entry_profile_next;
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_OBJECT_TAG, db->getName());
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_VICTIM_STEAM_TAG, string_printf("%llu", entry->next->steam_id));
			RenX::processTags(profile_data, *entry->next);
			result->append(profile_data);
		}
		result->append("</div>"sv);
	}

	if ((format & this->FLAG_INCLUDE_PAGE_FOOTER) != 0) // Footer
		result->append(RenX_Ladder_WebPlugin::footer);

	return result;
}